

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_order_cancel *m)

{
  bool bVar1;
  pointer ppVar2;
  long in_RSI;
  uint64_t in_RDI;
  uint64_t in_stack_00000010;
  uint64_t in_stack_00000018;
  order_book *in_stack_00000020;
  uint64_t timestamp;
  order_book *ob;
  iterator it;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *in_stack_ffffffffffffff58;
  event *__args;
  function<void_(const_helix::event_&)> *this_00;
  string *in_stack_ffffffffffffff78;
  undefined1 local_78 [80];
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  ulong local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_18;
  long local_10;
  
  local_20 = (ulong)*(ushort *)(in_RSI + 1);
  local_10 = in_RSI;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x1461a9);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::__detail::operator!=(&local_18,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x1461f2);
    __args = (event *)&ppVar2->second;
    this_00 = *(function<void_(const_helix::event_&)> **)(local_10 + 0xb);
    local_78._72_8_ = __args;
    __bswap_32(*(__uint32_t *)(local_10 + 0x13));
    order_book::cancel(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    local_78._64_8_ = itch50_timestamp(0x14624c);
    order_book::set_timestamp((order_book *)local_78._72_8_,local_78._64_8_);
    order_book::symbol_abi_cxx11_((order_book *)local_78._72_8_);
    make_ob_event(in_stack_ffffffffffffff78,in_RDI,(order_book *)local_78,
                  (event_mask)((ulong)this_00 >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()(this_00,__args);
    event::~event((event *)0x1462a4);
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_order_cancel* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;
        ob.cancel(m->OrderReferenceNumber, be32toh(m->CanceledShares));
        auto timestamp = itch50_timestamp(m->Timestamp);
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}